

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *window;
  
  pIVar2 = GImGui;
  GImGui->NavLayer = layer;
  pIVar1 = pIVar2->NavWindow;
  window = pIVar1;
  if (layer == ImGuiNavLayer_Main) {
    window = pIVar1->NavLastChildNavWindow;
    if ((window == (ImGuiWindow *)0x0) || (window->WasActive == false)) {
      window = pIVar1;
    }
    pIVar2->NavWindow = window;
    if (window->NavLastIds[0] != 0) {
      ImGui::SetNavIDWithRectRel(window->NavLastIds[0],0,0,window->NavRectRel);
      return;
    }
  }
  ImGui::NavInitWindow(window,true);
  return;
}

Assistant:

static void NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = ImGui::NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (layer == 0 && window->NavLastIds[0] != 0)
        ImGui::SetNavIDWithRectRel(window->NavLastIds[0], layer, 0, window->NavRectRel[0]);
    else
        ImGui::NavInitWindow(window, true);
}